

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorprint.cc
# Opt level: O0

void benchmark::ColorPrintf(ostream *out,LogColor color,char *fmt,__va_list_tag *args)

{
  ostream *poVar1;
  LogColor in_ESI;
  ostream *in_RDI;
  char *color_code;
  __va_list_tag *in_stack_000000f0;
  char *in_stack_000000f8;
  string local_78 [48];
  string local_48 [32];
  PlatformColorCode local_28;
  ostream *local_8;
  
  local_8 = in_RDI;
  local_28 = anon_unknown_6::GetPlatformColorCode(in_ESI);
  poVar1 = local_8;
  if (local_28 != (PlatformColorCode)0x0) {
    FormatString_abi_cxx11_((char *)local_48,"\x1b[0;3%sm",local_28);
    std::operator<<(poVar1,local_48);
    std::__cxx11::string::~string(local_48);
  }
  FormatString_abi_cxx11_(in_stack_000000f8,in_stack_000000f0);
  poVar1 = std::operator<<(local_8,local_78);
  std::operator<<(poVar1,"\x1b[m");
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void ColorPrintf(std::ostream& out, LogColor color, const char* fmt, va_list args) {
#ifdef BENCHMARK_OS_WINDOWS
  ((void)out); // suppress unused warning

  const HANDLE stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stdout_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stdout);
  SetConsoleTextAttribute(stdout_handle,
                          GetPlatformColorCode(color) | FOREGROUND_INTENSITY);
  vprintf(fmt, args);

  fflush(stdout);
  // Restores the text color.
  SetConsoleTextAttribute(stdout_handle, old_color_attrs);
#else
  const char* color_code = GetPlatformColorCode(color);
  if (color_code) out << FormatString("\033[0;3%sm", color_code);
  out << FormatString(fmt, args) << "\033[m";
#endif

}